

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

void google::SafeAppendString(char *source,char *dest,size_t dest_size)

{
  size_t sVar1;
  
  sVar1 = strlen(dest);
  if (sVar1 <= dest_size && dest_size - sVar1 != 0) {
    strncpy(dest + sVar1,source,dest_size - sVar1);
    dest[dest_size - 1] = '\0';
    return;
  }
  abort();
}

Assistant:

static void SafeAppendString(const char* source, char* dest, size_t dest_size) {
  size_t dest_string_length = strlen(dest);
  SAFE_ASSERT(dest_string_length < dest_size);
  dest += dest_string_length;
  dest_size -= dest_string_length;
  strncpy(dest, source, dest_size);
  // Making sure |dest| is always null-terminated.
  dest[dest_size - 1] = '\0';
}